

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.h
# Opt level: O0

void __thiscall Application::Application(Application *this)

{
  Application *this_local;
  
  FIX::Application::Application(&this->super_Application);
  FIX::MessageCracker::MessageCracker(&this->super_MessageCracker);
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__Application_001826e8;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_00182760;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_00182940;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_00182b30;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_00182e40;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_001832b0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_001838b0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_00183eb0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_00184570;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_00184f60;
  OrderMatcher::OrderMatcher(&this->m_orderMatcher);
  IDGenerator::IDGenerator(&this->m_generator);
  return;
}

Assistant:

void onCreate(const FIX::SessionID &) {}